

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O1

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
Graph<unsigned_long,_scc::VectorType>::scc
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Graph<unsigned_long,_scc::VectorType> *this)

{
  pointer *ppvVar1;
  iterator __position;
  pointer pvVar2;
  iterator __position_00;
  pointer pNVar3;
  pointer ppNVar4;
  Node *i;
  pointer pNVar5;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *__range4;
  __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
  __tmp;
  pointer ppNVar6;
  pointer ppNVar7;
  Container *__range2;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  reversed_topological_order;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_78;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_60;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_48;
  
  dual_dfs(&local_48,this);
  if (local_48.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dual_dfs(&local_60,this);
  if (local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      ppNVar6 = local_60.
                super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (local_60.
          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->visited == false) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_realloc_insert<>(__return_storage_ptr__,__position);
        }
        else {
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        local_78.
        super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Node::primal_dfs(*ppNVar6,&local_78);
        ppNVar4 = local_78.
                  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppNVar7 = local_78.
                       super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppNVar7 != ppNVar4;
            ppNVar7 = ppNVar7 + 1) {
          pvVar2 = (__return_storage_ptr__->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          __position_00._M_current =
               pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar2 + -1),
                       __position_00,&(*ppNVar7)->name);
          }
          else {
            *__position_00._M_current = (*ppNVar7)->name;
            pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
        if (local_78.
            super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppNVar6;
    } while (ppNVar6 !=
             local_60.
             super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  pNVar3 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar5 = (this->nodes).
                super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar3; pNVar5 = pNVar5 + 1) {
    pNVar5->visited = false;
  }
  if (local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Index>> scc() {
        dual_dfs();
        std::vector<std::vector<Index>> result;
        auto reversed_topological_order = dual_dfs();
        for (auto i = reversed_topological_order.rbegin(); i != reversed_topological_order.rend(); ++i) {
            if (!(*i)->visited) {
                result.emplace_back();
                std::vector<const Node *> subgraph{};
                (*i)->primal_dfs(subgraph);
                for (auto j: subgraph) {
                    result.back().push_back(j->name);
                }
            }
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return result;
    }